

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O3

int get_drl_refmv_count(MACROBLOCK *x,MV_REFERENCE_FRAME *ref_frame,PREDICTION_MODE mode)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  byte in_CL;
  char cVar5;
  
  cVar5 = (char)ref_frame;
  if ('\0' < (char)mode) {
    if ('\x04' < cVar5 || mode < 5) {
      lVar4 = 0;
      do {
        if (((&comp_ref0_lut)[lVar4] == cVar5) && ((&comp_ref1_lut)[lVar4] == mode)) {
          cVar5 = (char)lVar4 + '\x14';
          goto LAB_0021dd3b;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 9);
    }
    cVar5 = cVar5 + mode * '\x04' + -0xd;
  }
LAB_0021dd3b:
  if ((0x15 < in_CL) || (uVar2 = 1, (0x244000U >> (in_CL & 0x1f) & 1) == 0)) {
    uVar2 = (uint)(in_CL == 0x16);
  }
  bVar1 = (x->mbmi_ext).ref_mv_count[cVar5];
  if (((uVar2 == 0) || (bVar1 < 3)) && (((in_CL & 0xf7) != 0x10 || (bVar1 < 2)))) {
    return 1;
  }
  iVar3 = 3;
  if ((int)(bVar1 - uVar2) < 3) {
    iVar3 = bVar1 - uVar2;
  }
  return iVar3;
}

Assistant:

static inline int8_t av1_ref_frame_type(const MV_REFERENCE_FRAME *const rf) {
  if (rf[1] > INTRA_FRAME) {
    const int8_t uni_comp_ref_idx = get_uni_comp_ref_idx(rf);
    if (uni_comp_ref_idx >= 0) {
      assert((REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx) <
             MODE_CTX_REF_FRAMES);
      return REF_FRAMES + FWD_REFS * BWD_REFS + uni_comp_ref_idx;
    } else {
      return REF_FRAMES + FWD_RF_OFFSET(rf[0]) +
             BWD_RF_OFFSET(rf[1]) * FWD_REFS;
    }
  }

  return rf[0];
}